

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

void Au_NtkPrintStats(Au_Ntk_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  Au_Ntk_t *p_local;
  
  pcVar6 = Au_NtkName(p);
  printf("%-30s:",pcVar6);
  uVar1 = Au_NtkPiNum(p);
  uVar2 = Au_NtkPoNum(p);
  printf(" i/o =%6d/%6d",(ulong)uVar1,(ulong)uVar2);
  iVar3 = Au_NtkFlopNum(p);
  if (iVar3 != 0) {
    uVar1 = Au_NtkFlopNum(p);
    printf("  lat =%5d",(ulong)uVar1);
  }
  uVar1 = Au_NtkNodeNum(p);
  printf("  nd =%6d",(ulong)uVar1);
  uVar1 = Au_NtkBoxNum(p);
  printf("  box =%5d",(ulong)uVar1);
  uVar1 = Au_NtkObjNum(p);
  printf("  obj =%7d",(ulong)uVar1);
  iVar3 = Au_NtkObjNumMax(p);
  iVar4 = Au_NtkObjNum(p);
  iVar5 = Au_NtkObjNumMax(p);
  printf(" %5.1f %%",((double)(iVar3 - iVar4) * 100.0) / (double)iVar5);
  iVar3 = Au_NtkMemUsage(p);
  printf(" %6.1f MB",((double)iVar3 * 1.0) / 1048576.0);
  printf(" %5.1f %%",((double)(p->nObjsAlloc - p->nObjsUsed) * 100.0) / (double)p->nObjsAlloc);
  printf("\n");
  return;
}

Assistant:

void Au_NtkPrintStats( Au_Ntk_t * p )
{
    printf( "%-30s:",        Au_NtkName(p) );
    printf( " i/o =%6d/%6d", Au_NtkPiNum(p), Au_NtkPoNum(p) );
    if ( Au_NtkFlopNum(p) )
        printf( "  lat =%5d",    Au_NtkFlopNum(p) );
    printf( "  nd =%6d",     Au_NtkNodeNum(p) );
//    if ( Au_NtkBoxNum(p) )
        printf( "  box =%5d",    Au_NtkBoxNum(p) );
    printf( "  obj =%7d",    Au_NtkObjNum(p) );
//    printf( "  max =%7d",    Au_NtkObjNumMax(p) );
//    printf( "  use =%7d",    p->nObjsUsed );
    printf( " %5.1f %%",     100.0 * (Au_NtkObjNumMax(p) - Au_NtkObjNum(p)) / Au_NtkObjNumMax(p) );
    printf( " %6.1f MB",     1.0 * Au_NtkMemUsage(p) / (1 << 20) );
    printf( " %5.1f %%",     100.0 * (p->nObjsAlloc - p->nObjsUsed) / p->nObjsAlloc );
    printf( "\n" );
}